

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_make_contiguous_when_aligned_with_page_Test::
~Buffer_make_contiguous_when_aligned_with_page_Test
          (Buffer_make_contiguous_when_aligned_with_page_Test *this)

{
  Buffer_make_contiguous_when_aligned_with_page_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(Buffer, make_contiguous_when_aligned_with_page) {
    BufferWithReadonlyStrings local;
    auto const n_expected_readable = std::size(local.allstrs);
    auto constexpr n_pages_in = std::size(strs);
    EXPECT_EQ(n_expected_readable, bfy_buffer_get_content_len(&local.buf));
    EXPECT_EQ(n_pages_in, buffer_count_pages(&local.buf));

    // try to make the first two pages contiguous
    auto constexpr n_expected_vecs = n_pages_in - 1;
    auto const n_bytes_contiguous = n_expected_readable - std::size(strs.back());
    bfy_buffer_make_contiguous(&local.buf, n_bytes_contiguous);

    // test that the pages look right
    auto vecs = std::array<bfy_iovec, n_expected_vecs>{};
    EXPECT_EQ(n_expected_vecs, bfy_buffer_peek_all(&local.buf, std::data(vecs), n_expected_vecs));
    EXPECT_EQ(n_bytes_contiguous, vecs[0].iov_len);
    EXPECT_NE(std::data(str1), vecs[0].iov_base);
    EXPECT_EQ(std::size(strs.back()), vecs[1].iov_len);
    EXPECT_EQ(std::data(strs.back()), vecs[1].iov_base);
    EXPECT_EQ(n_expected_readable, bfy_buffer_get_content_len(&local.buf));
}